

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2AppendChild(xmlParserCtxtPtr ctxt,xmlNodePtr node)

{
  uint uVar1;
  _xmlNode *p_Var2;
  xmlDocPtr *ppxVar3;
  xmlDocPtr pxVar4;
  uint uVar5;
  
  if (ctxt->inSubset == 2) {
    ppxVar3 = (xmlDocPtr *)&ctxt->myDoc->extSubset;
  }
  else if (ctxt->inSubset == 1) {
    ppxVar3 = (xmlDocPtr *)&ctxt->myDoc->intSubset;
  }
  else {
    pxVar4 = (xmlDocPtr)ctxt->node;
    if (pxVar4 != (xmlDocPtr)0x0) goto LAB_00146246;
    ppxVar3 = &ctxt->myDoc;
  }
  pxVar4 = *ppxVar3;
LAB_00146246:
  p_Var2 = pxVar4->last;
  if (p_Var2 == (_xmlNode *)0x0) {
    pxVar4->children = node;
  }
  else {
    p_Var2->next = node;
    node->prev = p_Var2;
  }
  pxVar4->last = node;
  node->parent = (_xmlNode *)pxVar4;
  if (((node->type != XML_TEXT_NODE) && (ctxt->linenumbers != 0)) &&
     (ctxt->input != (xmlParserInputPtr)0x0)) {
    uVar1 = ctxt->input->line;
    uVar5 = 0xffff;
    if (uVar1 < 0xffff) {
      uVar5 = uVar1;
    }
    node->line = (unsigned_short)uVar5;
  }
  return;
}

Assistant:

static void
xmlSAX2AppendChild(xmlParserCtxtPtr ctxt, xmlNodePtr node) {
    xmlNodePtr parent;
    xmlNodePtr last;

    if (ctxt->inSubset == 1) {
	parent = (xmlNodePtr) ctxt->myDoc->intSubset;
    } else if (ctxt->inSubset == 2) {
	parent = (xmlNodePtr) ctxt->myDoc->extSubset;
    } else {
        parent = ctxt->node;
        if (parent == NULL)
            parent = (xmlNodePtr) ctxt->myDoc;
    }

    last = parent->last;
    if (last == NULL) {
        parent->children = node;
    } else {
        last->next = node;
        node->prev = last;
    }

    parent->last = node;
    node->parent = parent;

    if ((node->type != XML_TEXT_NODE) &&
        (ctxt->linenumbers) &&
	(ctxt->input != NULL)) {
        if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
            node->line = ctxt->input->line;
        else
            node->line = USHRT_MAX;
    }
}